

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temper.cpp
# Opt level: O1

void applyBadTemperament(MidiFile *midifile,int base)

{
  int iVar1;
  MidiEventList *pMVar2;
  int iVar3;
  uint aTrack;
  MidiEvent event;
  MidiEvent MStack_68;
  
  iVar1 = smf::MidiFile::getTrackCount(midifile);
  smf::MidiEvent::MidiEvent(&MStack_68);
  MStack_68.tick = 0;
  iVar3 = base + 1;
  if (base < 9) {
    iVar3 = base;
  }
  smf::MidiMessage::makePitchBendDouble(&MStack_68.super_MidiMessage,iVar3,0.2);
  aTrack = (uint)(iVar1 != 1);
  pMVar2 = smf::MidiFile::operator[](midifile,aTrack);
  smf::MidiEventList::append(pMVar2,&MStack_68);
  iVar3 = base + 2;
  if (base < 8) {
    iVar3 = base + 1;
  }
  smf::MidiMessage::makePitchBendDouble(&MStack_68.super_MidiMessage,iVar3,0.15);
  pMVar2 = smf::MidiFile::operator[](midifile,aTrack);
  smf::MidiEventList::append(pMVar2,&MStack_68);
  smf::MidiMessage::makePitchBendDouble(&MStack_68.super_MidiMessage,(base < 7 ^ 3) + base,0.1);
  pMVar2 = smf::MidiFile::operator[](midifile,aTrack);
  smf::MidiEventList::append(pMVar2,&MStack_68);
  smf::MidiMessage::makePitchBendDouble
            (&MStack_68.super_MidiMessage,(base - (uint)(base < 6)) + 4,-0.1);
  pMVar2 = smf::MidiFile::operator[](midifile,aTrack);
  smf::MidiEventList::append(pMVar2,&MStack_68);
  smf::MidiMessage::makePitchBendDouble(&MStack_68.super_MidiMessage,(base < 5 ^ 5) + base,-0.15);
  pMVar2 = smf::MidiFile::operator[](midifile,aTrack);
  smf::MidiEventList::append(pMVar2,&MStack_68);
  smf::MidiMessage::makePitchBendDouble
            (&MStack_68.super_MidiMessage,(base - (uint)(base < 4)) + 6,0.2);
  pMVar2 = smf::MidiFile::operator[](midifile,aTrack);
  smf::MidiEventList::append(pMVar2,&MStack_68);
  smf::MidiMessage::makePitchBendDouble(&MStack_68.super_MidiMessage,(base < 3 ^ 7) + base,-0.05);
  pMVar2 = smf::MidiFile::operator[](midifile,aTrack);
  smf::MidiEventList::append(pMVar2,&MStack_68);
  smf::MidiMessage::makePitchBendDouble
            (&MStack_68.super_MidiMessage,(base - (uint)(base < 2)) + 8,-0.1);
  pMVar2 = smf::MidiFile::operator[](midifile,aTrack);
  smf::MidiEventList::append(pMVar2,&MStack_68);
  smf::MidiMessage::makePitchBendDouble(&MStack_68.super_MidiMessage,(base < 1 ^ 9) + base,-0.4);
  pMVar2 = smf::MidiFile::operator[](midifile,aTrack);
  smf::MidiEventList::append(pMVar2,&MStack_68);
  smf::MidiMessage::makePitchBendDouble
            (&MStack_68.super_MidiMessage,(base >> 0x1f) + base + 10,-0.3);
  pMVar2 = smf::MidiFile::operator[](midifile,aTrack);
  smf::MidiEventList::append(pMVar2,&MStack_68);
  smf::MidiMessage::makePitchBendDouble(&MStack_68.super_MidiMessage,(base < -1 ^ 0xb) + base,0.25);
  pMVar2 = smf::MidiFile::operator[](midifile,aTrack);
  smf::MidiEventList::append(pMVar2,&MStack_68);
  smf::MidiMessage::makePitchBendDouble
            (&MStack_68.super_MidiMessage,(base - (uint)(base < -2)) + 0xc,-0.025);
  pMVar2 = smf::MidiFile::operator[](midifile,aTrack);
  smf::MidiEventList::append(pMVar2,&MStack_68);
  smf::MidiEvent::~MidiEvent(&MStack_68);
  return;
}

Assistant:

void applyBadTemperament(MidiFile& midifile, int base) {
	int tracks = midifile.getTrackCount();
	int track = (tracks == 1) ? 0 : 1;
	MidiEvent event;
	event.tick = 0;
	int chan;

	chan = 0 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBendDouble(chan, 0.2);
	midifile[track].append(event); // C:   40 cents from equal temperament

	chan = 1 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBendDouble(chan, 0.15);
	midifile[track].append(event); // C#:  30 cents from equal temperament

	chan = 2 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBendDouble(chan, 0.1);
	midifile[track].append(event); // D:   20 cents from equal temperament

	chan = 3 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBendDouble(chan, -0.1);
	midifile[track].append(event); // Ef: -20 cents from equal temperament

	chan = 4 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBendDouble(chan, -0.15);
	midifile[track].append(event); // E: -30 cents from equal temperament

	chan = 5 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBendDouble(chan, 0.2);
	midifile[track].append(event); // F: 40 cents from equal temperament

	chan = 6 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBendDouble(chan, -0.05);
	midifile[track].append(event); // F#: -10 cents from equal temperament

	chan = 7 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBendDouble(chan, -0.1);
	midifile[track].append(event); // G: -20 cents from equal temperament

	chan = 8 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBendDouble(chan, -0.4);
	midifile[track].append(event); // Af: -20 cents from equal temperament

	chan = 9 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBendDouble(chan, -0.3);
	midifile[track].append(event); // A: -15 cents from equal temperament

	chan = 10 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBendDouble(chan, 0.25);
	midifile[track].append(event); // Bf: 50 cents from equal temperament

	chan = 11 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBendDouble(chan, -0.025);
	midifile[track].append(event); // B: 5 cents from equal temperament
}